

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O2

void cjson_add_bool_should_fail_with_null_pointers(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = cJSON_CreateObject();
  pcVar1 = cJSON_AddBoolToObject((cJSON *)0x0,"false",0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xb3);
  }
  pcVar1 = cJSON_AddBoolToObject(object,(char *)0x0,0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xb4);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_bool_should_fail_with_null_pointers(void)
{
    cJSON *root = cJSON_CreateObject();

    TEST_ASSERT_NULL(cJSON_AddBoolToObject(NULL, "false", false));
    TEST_ASSERT_NULL(cJSON_AddBoolToObject(root, NULL, false));

    cJSON_Delete(root);
}